

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

string * cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                   (string *__return_storage_ptr__,string *prefix,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *r,string *suffix,string *sep)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((r->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(&local_48,suffix,sep);
    std::operator+(&local_a8,&local_48,prefix);
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&local_88,r,local_a8._M_dataplus._M_p);
    std::operator+(&local_68,prefix,&local_88);
    std::operator+(__return_storage_ptr__,&local_68,suffix);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWrap(std::string prefix, Range const& r, std::string suffix,
                   std::string sep)
{
  if (r.empty())
    {
    return std::string();
    }
  return prefix + cmJoin(r, (suffix + sep + prefix).c_str()) + suffix;
}